

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fopen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  undefined8 *pChunk;
  uint uVar2;
  jx9_io_stream *pjVar3;
  void *pvVar4;
  byte bVar5;
  char *pcVar6;
  sxi32 iErr;
  jx9_value **ppjVar7;
  jx9_value *pjVar8;
  jx9_vm *pjVar9;
  int use_include;
  byte *pbVar10;
  byte *pbVar11;
  int imLen;
  char *zUri;
  int iLen;
  jx9_io_stream *local_40;
  undefined8 *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pjVar9 = pCtx->pVm;
    pcVar6 = "Expecting a file path or URL";
    iErr = 2;
LAB_0013f4cf:
    jx9VmThrowError(pjVar9,&pjVar1->sName,iErr,pcVar6);
  }
  else {
    zUri = jx9_value_to_string(*apArg,&iLen);
    if (nArg == 1) {
      imLen = 1;
      pbVar10 = (byte *)0x147ed9;
    }
    else {
      pbVar10 = (byte *)jx9_value_to_string(apArg[1],&imLen);
    }
    pjVar3 = jx9VmGetStreamDevice(pCtx->pVm,&zUri,iLen);
    if (pjVar3 != (jx9_io_stream *)0x0) {
      local_38 = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
      if (local_38 == (undefined8 *)0x0) {
        pjVar1 = pCtx->pFunc;
        pjVar9 = pCtx->pVm;
        pcVar6 = "JX9 is running out of memory";
        iErr = 1;
        goto LAB_0013f4cf;
      }
      if (nArg < 4) {
        ppjVar7 = apArg;
        if (pjVar3 == &sjx9Stream) goto LAB_0013f5cc;
        pjVar8 = (jx9_value *)0x0;
      }
      else {
        ppjVar7 = apArg + 3;
LAB_0013f5cc:
        pjVar8 = *ppjVar7;
      }
      pjVar9 = pCtx->pVm;
      *local_38 = pjVar3;
      local_38[3] = 0;
      local_38[4] = 0;
      local_38[2] = pjVar9;
      *(undefined4 *)(local_38 + 5) = 0;
      local_38[6] = 0xfeac1400000000;
      local_40 = pjVar3;
      if ((long)imLen < 1) {
        uVar2 = 1;
      }
      else {
        pbVar11 = pbVar10 + imLen;
        bVar5 = *pbVar10 & 0xdf;
        if (bVar5 < 0x52) {
          if (bVar5 == 0x41) {
            pbVar10 = pbVar10 + 1;
            uVar2 = 0x2a;
            if (imLen != 1) {
              uVar2 = (uint)(*pbVar10 == 0x2b) * 2 + 0x2a;
            }
          }
          else if (bVar5 == 0x43) {
            pbVar10 = pbVar10 + 1;
            uVar2 = 10;
            if (imLen != 1) {
              uVar2 = (uint)(*pbVar10 == 0x2b) * 2 + 10;
            }
          }
          else {
LAB_0013f73c:
            jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,3,
                            "Invalid open mode, JX9 is assuming a Read-Only open");
            uVar2 = 1;
          }
        }
        else if (bVar5 == 0x58) {
          pbVar10 = pbVar10 + 1;
          uVar2 = 0x42;
          if ((imLen != 1) &&
             (((bVar5 = *pbVar10, bVar5 == 0x2b || (bVar5 == 0x72)) || (bVar5 == 0x52)))) {
            uVar2 = 0x44;
          }
        }
        else if (bVar5 == 0x57) {
          pbVar10 = pbVar10 + 1;
          uVar2 = 0x1a;
          if ((imLen != 1) &&
             (((bVar5 = *pbVar10, bVar5 == 0x2b || (bVar5 == 0x72)) || (bVar5 == 0x52)))) {
            uVar2 = 0x1c;
          }
        }
        else {
          if (bVar5 != 0x52) goto LAB_0013f73c;
          pbVar10 = pbVar10 + 1;
          uVar2 = 1;
          if ((imLen != 1) &&
             (((bVar5 = *pbVar10, bVar5 == 0x2b || (bVar5 == 0x77)) || (bVar5 == 0x57)))) {
            uVar2 = 4;
          }
        }
        for (; pbVar10 < pbVar11; pbVar10 = pbVar10 + 1) {
          if ((*pbVar10 & 0xdf) == 0x54) {
            uVar2 = uVar2 & 0xfffffd7f | 0x200;
          }
          else if ((*pbVar10 & 0xdf) == 0x42) {
            uVar2 = uVar2 & 0xfffffd7f | 0x80;
          }
        }
      }
      pcVar6 = zUri;
      pjVar9 = pCtx->pVm;
      use_include = 0;
      if (2 < nArg) {
        pObj = apArg[2];
        jx9MemObjToBool(pObj);
        use_include = *(int *)&pObj->x;
      }
      pvVar4 = jx9StreamOpenHandle(pjVar9,local_40,pcVar6,uVar2,use_include,pjVar8,0,(int *)0x0);
      pChunk = local_38;
      local_38[1] = pvVar4;
      if (pvVar4 == (void *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar6);
        pjVar8 = pCtx->pRet;
        jx9MemObjRelease(pjVar8);
        (pjVar8->x).rVal = 0.0;
        pjVar8->iFlags = pjVar8->iFlags & 0xfffffe90U | 8;
        jx9_context_free_chunk(pCtx,pChunk);
        return 0;
      }
      pjVar8 = pCtx->pRet;
      jx9MemObjRelease(pjVar8);
      (pjVar8->x).pOther = pChunk;
      uVar2 = pjVar8->iFlags & 0xfffffe90U | 0x100;
      goto LAB_0013f4f2;
    }
    jx9_context_throw_error_format
              (pCtx,2,"No stream device is associated with the given URI(%s)",zUri);
  }
  pjVar8 = pCtx->pRet;
  jx9MemObjRelease(pjVar8);
  (pjVar8->x).rVal = 0.0;
  uVar2 = pjVar8->iFlags & 0xfffffe90U | 8;
LAB_0013f4f2:
  pjVar8->iFlags = uVar2;
  return 0;
}

Assistant:

static int jx9Builtin_fopen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zUri, *zMode;
	jx9_value *pResource;
	io_private *pDev;
	int iLen, imLen;
	int iOpenFlags;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path or URL");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the URI and the desired access mode */
	zUri  = jx9_value_to_string(apArg[0], &iLen);
	if( nArg > 1 ){
		zMode = jx9_value_to_string(apArg[1], &imLen);
	}else{
		/* Set a default read-only mode */
		zMode = "r";
		imLen = (int)sizeof(char);
	}
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zUri, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given URI(%s)", zUri);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pResource = 0;
	if( nArg > 3 ){
		pResource = apArg[3];
	}else if( is_jx9_stream(pStream) ){
		/* TICKET 1433-80: The jx9:// stream need a jx9_value to access the underlying
		 * virtual machine.
		 */
		pResource = apArg[0];
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Convert open mode to JX9 flags */
	iOpenFlags = StrModeToFlags(pCtx, zMode, imLen);
	/* Try to get a handle */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zUri, iOpenFlags, 
		nArg > 2 ? jx9_value_to_bool(apArg[2]) : FALSE, pResource, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zUri);
		jx9_result_bool(pCtx, 0);
		jx9_context_free_chunk(pCtx, pDev);
		return JX9_OK;
	}
	/* All done, return the io_private instance as a resource */
	jx9_result_resource(pCtx, pDev);
	return JX9_OK;
}